

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<VIBE> * __thiscall
pybind11::class_<VIBE>::
def<pybind11::array_t<unsigned_char,16>(VIBE::*)(pybind11::array_t<unsigned_char,16>&),pybind11::return_value_policy>
          (class_<VIBE> *this,char *name_,offset_in_VIBE_to_subr *f,return_value_policy *extra)

{
  offset_in_VIBE_to_subr f_00;
  name *extra_00;
  cpp_function cf;
  handle local_58;
  cpp_function local_50;
  object local_48;
  sibling local_40;
  is_method local_38;
  PyObject *local_30;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_40.value.m_ptr = (handle)(this->super_generic_type).super_object.super_handle.m_ptr;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_38.class_.m_ptr = (handle)(handle)name_;
  getattr((pybind11 *)&local_58,local_40.value,name_,(PyObject *)&_Py_NoneStruct);
  local_30 = local_58.m_ptr;
  cpp_function::
  cpp_function<pybind11::array_t<unsigned_char,16>,VIBE,pybind11::array_t<unsigned_char,16>&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>
            (&local_50,f_00,extra_00,&local_38,&local_40,(return_value_policy *)&local_30);
  object::~object((object *)&local_58);
  object::~object(&local_48);
  detail::add_class_method((object *)this,name_,&local_50);
  object::~object((object *)&local_50);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }